

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O3

void __thiscall QPicture::setData(QPicture *this,char *data,uint size)

{
  QExplicitlySharedDataPointer<QPicturePrivate> *this_00;
  QPicturePrivate *pQVar1;
  
  pQVar1 = (this->d_ptr).d.ptr;
  this_00 = &this->d_ptr;
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 1) {
    QExplicitlySharedDataPointer<QPicturePrivate>::detach_helper(this_00);
    pQVar1 = (this_00->d).ptr;
  }
  QBuffer::setData((char *)&pQVar1->pictb,(longlong)data);
  pQVar1 = (this_00->d).ptr;
  pQVar1->formatOk = false;
  pQVar1->formatMajor = 0x17;
  pQVar1->formatMinor = 0;
  return;
}

Assistant:

void QPicture::setData(const char* data, uint size)
{
    detach();
    d_func()->pictb.setData(data, size);
    d_func()->resetFormat();                                // we'll have to check
}